

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O3

void __thiscall soul::ASTVisitor::visit(ASTVisitor *this,LoopStatement *l)

{
  if ((l->iterator).object != (Statement *)0x0) {
    (*this->_vptr_ASTVisitor[4])(this);
  }
  if ((l->body).object != (Statement *)0x0) {
    (*this->_vptr_ASTVisitor[4])(this);
  }
  if ((l->condition).object != (Expression *)0x0) {
    (*this->_vptr_ASTVisitor[3])(this);
  }
  if ((l->numIterations).object != (Expression *)0x0) {
    (*this->_vptr_ASTVisitor[3])(this);
  }
  if ((l->rangeLoopInitialiser).object != (VariableDeclaration *)0x0) {
    (*this->_vptr_ASTVisitor[4])(this);
    return;
  }
  return;
}

Assistant:

virtual void visit (AST::LoopStatement& l)
    {
        visitObjectIfNotNull (l.iterator);
        visitObjectIfNotNull (l.body);
        visitObjectIfNotNull (l.condition);
        visitObjectIfNotNull (l.numIterations);
        visitObjectIfNotNull (l.rangeLoopInitialiser);
    }